

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void NodeId_deleteMembers(UA_NodeId *p,UA_DataType *_)

{
  if ((p->identifierType != UA_NODEIDTYPE_BYTESTRING) && (p->identifierType != UA_NODEIDTYPE_STRING)
     ) {
    return;
  }
  free((void *)((ulong)(p->identifier).string.data & 0xfffffffffffffffe));
  return;
}

Assistant:

static void
NodeId_deleteMembers(UA_NodeId *p, const UA_DataType *_) {
    switch(p->identifierType) {
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
        String_deleteMembers(&p->identifier.string, NULL);
        break;
    default: break;
    }
}